

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.hpp
# Opt level: O2

string * __thiscall
gzip::compress_abi_cxx11_
          (string *__return_storage_ptr__,gzip *this,char *data,size_t size,int level)

{
  Compressor comp;
  Compressor local_20;
  
  local_20.max_ = 2000000000;
  local_20.level_ = (int)size;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  Compressor::compress<std::__cxx11::string>
            (&local_20,__return_storage_ptr__,(char *)this,(size_t)data);
  return __return_storage_ptr__;
}

Assistant:

inline std::string compress(const char *data,
                                std::size_t size,
                                int level = Z_DEFAULT_COMPRESSION) {
        Compressor comp(level);
        std::string output;
        comp.compress(output, data, size);
        return output;
    }